

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *__s2;
  int local_2c;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x3b1,"int Abc_NtkLogicHasSimpleCos(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_2c) {
      return 1;
    }
    pAVar2 = Abc_NtkCo(pNtk,local_2c);
    pAVar3 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjFaninC0(pAVar2);
    if (iVar1 != 0) break;
    iVar1 = Abc_ObjIsCi(pAVar3);
    if (iVar1 != 0) {
      pcVar4 = Abc_ObjName(pAVar3);
      __s2 = Abc_ObjName(pAVar2);
      iVar1 = strcmp(pcVar4,__s2);
      if (iVar1 != 0) {
        return 0;
      }
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
    if (iVar1 == 0) {
      pAVar2 = (Abc_Obj_t *)Abc_ObjName(pAVar2);
      pAVar3->pNext = pAVar2;
      Abc_NodeSetTravIdCurrent(pAVar3);
    }
    else {
      pAVar3 = pAVar3->pNext;
      pcVar4 = Abc_ObjName(pAVar2);
      iVar1 = strcmp((char *)pAVar3,pcVar4);
      if (iVar1 != 0) {
        return 0;
      }
    }
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkLogicHasSimpleCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pDriver;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
            return 0;
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
            return 0;
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
            return 0;
    }
    return 1;
}